

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearlyTransformedCosines.cpp
# Opt level: O2

int __thiscall
arealights::LinearlyTransformedCosines::init(LinearlyTransformedCosines *this,EVP_PKEY_CTX *ctx)

{
  string *vertexShaderPath;
  undefined8 __p;
  int extraout_EAX;
  allocator<char> local_5a;
  allocator<char> local_59;
  undefined1 local_58 [40];
  string local_30;
  
  vertexShaderPath =
       (string *)
       (this->_renderHelper).
       super___shared_ptr<arealights::RenderHelper,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"../assets/LTC.vs.glsl",&local_59);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_58 + 8),"../assets/LTC.fs.glsl",&local_5a);
  RenderHelper::makeSimpleShader((RenderHelper *)local_58,vertexShaderPath,&local_30);
  __p = local_58._0_8_;
  local_58._0_8_ = (__uniq_ptr_impl<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_>)0x0;
  std::__uniq_ptr_impl<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_>::reset
            ((__uniq_ptr_impl<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_> *)
             &this->_ltcShader,(pointer)__p);
  std::unique_ptr<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_>::~unique_ptr
            ((unique_ptr<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_> *)local_58);
  std::__cxx11::string::~string((string *)(local_58 + 8));
  std::__cxx11::string::~string((string *)&local_30);
  loadLookupTextures(this);
  return extraout_EAX;
}

Assistant:

void LinearlyTransformedCosines::init()
{
    _ltcShader = _renderHelper->makeSimpleShader(
        "../assets/LTC.vs.glsl",
        "../assets/LTC.fs.glsl"
    );

    loadLookupTextures();
}